

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O2

void re2c::emit_action(Action *action,OutputFile *o,uint32_t ind,bool *readCh,State *s,
                      string *condName,Skeleton *skeleton,
                      set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
                      *used_labels,bool save_yyaccept)

{
  string *__rhs;
  uint32_t uVar1;
  Initial *__x;
  accept_t *accepts;
  pointer ppSVar2;
  pointer ppSVar3;
  RuleOp *pRVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  size_type sVar8;
  OutputFile *pOVar9;
  opt_t *poVar10;
  Code *pCVar11;
  opt_t *poVar12;
  size_t n;
  ulong n_00;
  char *s_00;
  State *value;
  string local_98;
  uint32_t local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  switch(action->type) {
  case MATCH:
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar12->target == DOT) goto switchD_00127019_caseD_3;
    if (s == (State *)0x0) {
      bVar5 = false;
    }
    else if (s->next == (State *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = (s->next->action).type != RULE;
    }
    if (s->fill == 0) {
      if (bVar5) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        InputAPI::stmt_skip_peek_abi_cxx11_(&local_98,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        *readCh = false;
      }
      else {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        InputAPI::stmt_skip_abi_cxx11_(&local_98,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        *readCh = true;
      }
    }
    else {
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      InputAPI::stmt_skip_abi_cxx11_(&local_98,&poVar12->input_api,ind);
      OutputFile::wstring(o,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    n = s->fill;
    if (n == 0) goto switchD_00127019_caseD_3;
    break;
  case INITIAL:
    __x = (action->info).initial;
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar12->target == DOT) goto switchD_00127019_caseD_3;
    sVar8 = std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::count
                      (used_labels,&s->label);
    if (sVar8 != 0) {
      if (s->fill == 0) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        InputAPI::stmt_skip_peek_abi_cxx11_(&local_98,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_98);
      }
      else {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        InputAPI::stmt_skip_abi_cxx11_(&local_98,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_98);
      }
      std::__cxx11::string::~string((string *)&local_98);
    }
    sVar8 = std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::count
                      (used_labels,&__x->label);
    if (sVar8 != 0) {
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      pOVar9 = OutputFile::wstring(o,&poVar12->labelPrefix);
      pOVar9 = OutputFile::wlabel(pOVar9,(label_t)(__x->label).value);
      OutputFile::ws(pOVar9,":\n");
    }
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar12->dFlag == true) {
      pOVar9 = OutputFile::wind(o,ind);
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yydebug);
      pOVar9 = OutputFile::ws(pOVar9,"(");
      pOVar9 = OutputFile::wlabel(pOVar9,(label_t)(__x->label).value);
      pOVar9 = OutputFile::ws(pOVar9,", *");
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yycursor);
      OutputFile::ws(pOVar9,");\n");
    }
    n = s->fill;
    bVar5 = __x->setMarker;
    if (n == 0) {
      if (bVar5 != false) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        InputAPI::stmt_backup_abi_cxx11_(&local_98,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_98);
        goto LAB_00127884;
      }
LAB_0012788e:
      *readCh = false;
      goto switchD_00127019_caseD_3;
    }
    goto LAB_0012799d;
  case SAVE:
    uVar1 = (action->info).save;
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar12->target == DOT) goto switchD_00127019_caseD_3;
    if (save_yyaccept) {
      pOVar9 = OutputFile::wind(o,ind);
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yyaccept);
      pOVar9 = OutputFile::ws(pOVar9," = ");
      pOVar9 = OutputFile::wu32(pOVar9,uVar1);
      OutputFile::ws(pOVar9,";\n");
    }
    if (s->fill == 0) {
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      InputAPI::stmt_skip_backup_peek_abi_cxx11_(&local_98,&poVar12->input_api,ind);
      OutputFile::wstring(o,&local_98);
LAB_00127884:
      std::__cxx11::string::~string((string *)&local_98);
      goto LAB_0012788e;
    }
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    InputAPI::stmt_skip_backup_abi_cxx11_(&local_98,&poVar12->input_api,ind);
    OutputFile::wstring(o,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    n = s->fill;
    break;
  default:
    goto switchD_00127019_caseD_3;
  case ACCEPT:
    accepts = (action->info).accepts;
    ppSVar2 = (accepts->elems).
              super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppSVar3 = (accepts->elems).
              super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppSVar2 == ppSVar3) goto switchD_00127019_caseD_3;
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar12->target != DOT) {
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      InputAPI::stmt_restore_abi_cxx11_(&local_98,&poVar12->input_api,ind);
      OutputFile::wstring(o,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    if (*readCh == true) {
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      InputAPI::stmt_peek_abi_cxx11_(&local_98,&poVar12->input_api,ind);
      OutputFile::wstring(o,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      *readCh = false;
    }
    if ((long)ppSVar2 - (long)ppSVar3 == 8) {
      genGoTo(o,ind,s,*(accepts->elems).
                       super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,readCh);
      goto switchD_00127019_caseD_3;
    }
    n_00 = (long)ppSVar2 - (long)ppSVar3 >> 3;
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if ((poVar12->gFlag == true) &&
       (poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888), poVar12->cGotoThreshold <= n_00
       )) {
      pOVar9 = OutputFile::wind(o,ind);
      OutputFile::ws(pOVar9,"{\n");
      local_74 = ind + 1;
      pOVar9 = OutputFile::wind(o,ind + 1);
      pOVar9 = OutputFile::ws(pOVar9,"static void *");
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yytarget);
      pOVar9 = OutputFile::ws(pOVar9,"[");
      pOVar9 = OutputFile::wu64(pOVar9,n_00);
      OutputFile::ws(pOVar9,"] = {\n");
      for (uVar7 = 0; uVar1 = local_74, uVar7 < n_00; uVar7 = uVar7 + 1) {
        pOVar9 = OutputFile::wind(o,ind + 2);
        pOVar9 = OutputFile::ws(pOVar9,"&&");
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        pOVar9 = OutputFile::wstring(pOVar9,&poVar12->labelPrefix);
        pOVar9 = OutputFile::wlabel(pOVar9,(label_t)((accepts->elems).
                                                                                                          
                                                  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar7]->
                                                  label).value);
        OutputFile::ws(pOVar9,",\n");
      }
      pOVar9 = OutputFile::wind(o,local_74);
      OutputFile::ws(pOVar9,"};\n");
      pOVar9 = OutputFile::wind(o,uVar1);
      pOVar9 = OutputFile::ws(pOVar9,"goto *");
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yytarget);
      pOVar9 = OutputFile::ws(pOVar9,"[");
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yyaccept);
      OutputFile::ws(pOVar9,"];\n");
    }
    else {
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if ((poVar12->sFlag != false) ||
         (((long)ppSVar2 - (long)ppSVar3 == 0x10 &&
          (poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888), poVar12->target != DOT)))) {
        emit_accept_binary(o,ind,readCh,s,accepts,0,n_00 - 1);
        goto switchD_00127019_caseD_3;
      }
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if (poVar12->target == DOT) {
        for (uVar7 = 0; uVar7 < n_00; uVar7 = uVar7 + 1) {
          pOVar9 = OutputFile::wlabel(o,(label_t)(s->label).value);
          pOVar9 = OutputFile::ws(pOVar9," -> ");
          OutputFile::wlabel(pOVar9,(label_t)((accepts->elems).
                                              super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar7]->
                                             label).value);
          pOVar9 = OutputFile::ws(o," [label=\"yyaccept=");
          pOVar9 = OutputFile::wu32(pOVar9,uVar7);
          OutputFile::ws(pOVar9,"\"]\n");
        }
        goto switchD_00127019_caseD_3;
      }
      pOVar9 = OutputFile::wind(o,ind);
      pOVar9 = OutputFile::ws(pOVar9,"switch (");
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      pOVar9 = OutputFile::wstring(pOVar9,&poVar12->yyaccept);
      OutputFile::ws(pOVar9,") {\n");
      uVar7 = 0;
      while( true ) {
        pOVar9 = OutputFile::wind(o,ind);
        if (n_00 - 1 <= (ulong)uVar7) break;
        pOVar9 = OutputFile::ws(pOVar9,"case ");
        pOVar9 = OutputFile::wu32(pOVar9,uVar7);
        OutputFile::ws(pOVar9,": \t");
        genGoTo(o,0,s,(accepts->elems).
                      super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar7],readCh);
        uVar7 = uVar7 + 1;
      }
      OutputFile::ws(pOVar9,"default:\t");
      genGoTo(o,0,s,(accepts->elems).
                    super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[n_00 - 1],readCh);
    }
    pOVar9 = OutputFile::wind(o,ind);
    s_00 = "}\n";
    goto LAB_0012733d;
  case RULE:
    pRVar4 = (action->info).rule;
    value = s;
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar12->target != DOT) {
      iVar6 = (*pRVar4->ctx->_vptr_RegExp[4])();
      if ((iVar6 != 0) &&
         (poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888), poVar12->target != DOT)) {
        poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        InputAPI::stmt_restorectx_abi_cxx11_(&local_98,&poVar12->input_api,ind);
        OutputFile::wstring(o,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
      }
      poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if (poVar12->target == SKELETON) {
        Skeleton::emit_action(skeleton,o,ind,(rule_rank_t)(pRVar4->rank).value);
      }
      else {
        __rhs = &pRVar4->newcond;
        if (((pRVar4->newcond)._M_string_length != 0) &&
           (bVar5 = std::operator!=(condName,__rhs), bVar5)) {
          pOVar9 = OutputFile::wind(o,ind);
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
          std::__cxx11::string::string(local_50,(string *)&poVar12->cond_set);
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
          poVar10 = realopt_t::operator->((realopt_t *)&DAT_00166888);
          std::operator+(&local_70,&poVar10->condEnumPrefix,__rhs);
          replaceParam<std::__cxx11::string>
                    (&local_98,(re2c *)local_50,&poVar12->cond_set_arg,&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value);
          OutputFile::wstring(pOVar9,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string(local_50);
          poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
          if (poVar12->cond_set_naked == false) {
            pOVar9 = OutputFile::ws(o,"(");
            poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
            pOVar9 = OutputFile::wstring(pOVar9,&poVar12->condEnumPrefix);
            pOVar9 = OutputFile::wstring(pOVar9,__rhs);
            OutputFile::ws(pOVar9,");");
          }
          OutputFile::ws(o,"\n");
        }
        pCVar11 = pRVar4->code;
        if (pCVar11 == (Code *)0x0) {
          if ((pRVar4->newcond)._M_string_length != 0) {
            pOVar9 = OutputFile::wind(o,ind);
            poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
            std::__cxx11::string::string(local_50,(string *)&poVar12->condGoto);
            poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
            poVar10 = realopt_t::operator->((realopt_t *)&DAT_00166888);
            std::operator+(&local_70,&poVar10->condPrefix,__rhs);
            replaceParam<std::__cxx11::string>
                      (&local_98,(re2c *)local_50,&poVar12->condGotoParam,&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value);
            pOVar9 = OutputFile::wstring(pOVar9,&local_98);
            OutputFile::ws(pOVar9,"\n");
            std::__cxx11::string::~string((string *)&local_98);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string(local_50);
          }
        }
        else {
          if (yySetupRule_abi_cxx11_._8_8_ != 0) {
            pOVar9 = OutputFile::wind(o,ind);
            pOVar9 = OutputFile::wstring(pOVar9,(string *)yySetupRule_abi_cxx11_);
            OutputFile::ws(pOVar9,"\n");
            pCVar11 = pRVar4->code;
          }
          pOVar9 = OutputFile::wline_info
                             (o,(pCVar11->loc).line,(pCVar11->loc).filename._M_dataplus._M_p);
          pOVar9 = OutputFile::wind(pOVar9,ind);
          pOVar9 = OutputFile::wstring(pOVar9,&pRVar4->code->text);
          pOVar9 = OutputFile::ws(pOVar9,"\n");
          OutputFile::wdelay_line_info(pOVar9);
        }
      }
      goto switchD_00127019_caseD_3;
    }
    OutputFile::wlabel(o,(label_t)(s->label).value);
    if (pRVar4->code != (Code *)0x0) {
      pOVar9 = OutputFile::ws(o," [label=\"");
      pOVar9 = OutputFile::wstring(pOVar9,(string *)pRVar4->code);
      pOVar9 = OutputFile::ws(pOVar9,":");
      pOVar9 = OutputFile::wu32(pOVar9,(pRVar4->code->loc).line);
      OutputFile::ws(pOVar9,"\"]");
    }
    s_00 = "\n";
    pOVar9 = o;
LAB_0012733d:
    OutputFile::ws(pOVar9,s_00);
    goto switchD_00127019_caseD_3;
  }
  bVar5 = false;
LAB_0012799d:
  need(o,ind,readCh,n,bVar5);
switchD_00127019_caseD_3:
  if ((s->isPreCtxt == true) &&
     (poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888), poVar12->target != DOT)) {
    poVar12 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    InputAPI::stmt_backupctx_abi_cxx11_(&local_98,&poVar12->input_api,ind);
    OutputFile::wstring(o,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

void emit_action
	( const Action & action
	, OutputFile & o
	, uint32_t ind
	, bool & readCh
	, const State * const s
	, const std::string & condName
	, const Skeleton * skeleton
	, const std::set<label_t> & used_labels
	, bool save_yyaccept
	)
{
	switch (action.type)
	{
		case Action::MATCH:
			emit_match (o, ind, readCh, s);
			break;
		case Action::INITIAL:
			emit_initial (o, ind, readCh, s, * action.info.initial, used_labels);
			break;
		case Action::SAVE:
			emit_save (o, ind, readCh, s, action.info.save, save_yyaccept);
			break;
		case Action::MOVE:
			break;
		case Action::ACCEPT:
			emit_accept (o, ind, readCh, s, * action.info.accepts);
			break;
		case Action::RULE:
			emit_rule (o, ind, s, action.info.rule, condName, skeleton);
			break;
	}
	if (s->isPreCtxt && opts->target != opt_t::DOT)
	{
		o.wstring(opts->input_api.stmt_backupctx (ind));
	}
}